

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

void __thiscall pbrt::SquareMatrix<4>::SquareMatrix(SquareMatrix<4> *this)

{
  int j;
  int i;
  SquareMatrix<4> *this_local;
  
  for (i = 0; i < 4; i = i + 1) {
    for (j = 0; j < 4; j = j + 1) {
      this->m[i][j] = (float)(i == j);
    }
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    SquareMatrix() {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                m[i][j] = (i == j) ? 1 : 0;
    }